

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmainct.c
# Opt level: O3

void jinit_c_main_controller(j_compress_ptr cinfo,boolean need_full_buffer)

{
  jpeg_error_mgr *pjVar1;
  jpeg_c_main_controller *pjVar2;
  JSAMPARRAY ppJVar3;
  long lVar4;
  JDIMENSION *pJVar5;
  
  pjVar2 = (jpeg_c_main_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x70);
  cinfo->main = pjVar2;
  pjVar2->start_pass = start_pass_main;
  if (cinfo->raw_data_in == 0) {
    if (need_full_buffer != 0) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 4;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
      return;
    }
    if (0 < cinfo->num_components) {
      pJVar5 = &cinfo->comp_info->width_in_blocks;
      lVar4 = 0;
      do {
        ppJVar3 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,*pJVar5 << 3,pJVar5[-4] << 3);
        (&pjVar2[2].start_pass)[lVar4] = (_func_void_j_compress_ptr_J_BUF_MODE *)ppJVar3;
        lVar4 = lVar4 + 1;
        pJVar5 = pJVar5 + 0x18;
      } while (lVar4 < cinfo->num_components);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_main_controller(j_compress_ptr cinfo, boolean need_full_buffer)
{
  my_main_ptr main_ptr;
  int ci;
  jpeg_component_info *compptr;

  main_ptr = (my_main_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_main_controller));
  cinfo->main = (struct jpeg_c_main_controller *)main_ptr;
  main_ptr->pub.start_pass = start_pass_main;

  /* We don't need to create a buffer in raw-data mode. */
  if (cinfo->raw_data_in)
    return;

  /* Create the buffer.  It holds downsampled data, so each component
   * may be of a different size.
   */
  if (need_full_buffer) {
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
  } else {
    /* Allocate a strip buffer for each component */
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      main_ptr->buffer[ci] = (*cinfo->mem->alloc_sarray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE,
         compptr->width_in_blocks * DCTSIZE,
         (JDIMENSION)(compptr->v_samp_factor * DCTSIZE));
    }
  }
}